

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::~ManagedBuffer
          (ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  ~ManagedBuffer(this);
  operator_delete(this);
  return;
}

Assistant:

ManagedBuffer<T>::~ManagedBuffer() {}